

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

int __thiscall
H264StreamReader::writeAdditionData
          (H264StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  NALUnit *pNVar5;
  pointer puVar6;
  long lVar7;
  int iVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  undefined4 *puVar11;
  byte bVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  uint8_t *puVar15;
  uint8_t *dstBuffer_00;
  bool bVar16;
  ostringstream ss;
  uint *local_278;
  undefined8 local_270;
  uint local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  uint *local_258;
  undefined8 local_250;
  uint local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  uint *local_238;
  undefined8 local_230;
  uint local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  uint *local_218;
  undefined8 local_210;
  uint local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  uint *local_1f8;
  undefined8 local_1f0;
  uint local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_1d8;
  SEIUnit local_1d0;
  
  uVar2 = avPacket->size;
  dstBuffer_00 = dstBuffer;
  local_1d8 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)priorityData;
  if ((long)(ulong)uVar2 < (long)dstEnd - (long)dstBuffer && 4 < (int)uVar2) {
    puVar4 = avPacket->data;
    bVar12 = puVar4[4] & 0x1f;
    if ((bVar12 == 0x18) || (bVar12 == 9)) {
      this->m_delimiterFound = true;
      memcpy(dstBuffer,puVar4,(ulong)uVar2);
      dstBuffer_00 = dstBuffer + avPacket->size;
      avPacket->size = 0;
      avPacket->data = (uint8_t *)0x0;
    }
  }
  if ((this->m_delimiterFound == false) && (this->m_lastSliceSPS != 0xffffffff)) {
    if (this->m_firstAUDWarn == true) {
      this->m_firstAUDWarn = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"H264 bitstream changed: insert nal unit delimiters",0x32);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      sLastMsg = true;
    }
    if ((long)dstEnd - (long)dstBuffer_00 < 6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d0,"H264 stream error: Not enough buffer for write headers",0x36
                );
      puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar11 = 3;
      *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
      if (local_1f8 == &local_1e8) {
        puVar11[6] = local_1e8;
        puVar11[7] = uStack_1e4;
        puVar11[8] = uStack_1e0;
        puVar11[9] = uStack_1dc;
      }
      else {
        *(uint **)(puVar11 + 2) = local_1f8;
        *(ulong *)(puVar11 + 6) = CONCAT44(uStack_1e4,local_1e8);
      }
      *(undefined8 *)(puVar11 + 4) = local_1f0;
      local_1f0 = 0;
      local_1e8 = local_1e8 & 0xffffff00;
      local_1f8 = &local_1e8;
      __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
      *dstBuffer_00 = '\0';
      dstBuffer_00 = dstBuffer_00 + 1;
    }
    dstBuffer_00[0] = '\0';
    dstBuffer_00[1] = '\0';
    dstBuffer_00[2] = '\x01';
    if ((this->m_mvcSubStream == true) && (this->m_blurayMode == true)) {
      dstBuffer_00[3] = '\x18';
      dstBuffer_00 = dstBuffer_00 + 4;
    }
    else {
      dstBuffer_00[3] = '\t';
      dstBuffer_00[4] = (char)this->m_pict_type << 5 | 0x10;
      dstBuffer_00 = dstBuffer_00 + 5;
    }
  }
  uVar3 = this->m_lastSliceSPS;
  uVar2 = avPacket->flags;
  if (this->m_h264SPSCont == true) {
    if ((1 < this->m_spsCounter) ||
       (((iVar8 = (this->super_MPEGStreamReader).m_totalFrameNum, iVar8 < 2 ||
         (bVar12 = 1, this->m_lastSliceIDR == false)) &&
        ((iVar8 < 0xfb || (bVar12 = 1, this->m_lastIFrame == false)))))) {
      bVar12 = (uVar2 & 0x20) == 0 & this->m_firstFileFrame;
    }
  }
  else {
    bVar12 = 0;
  }
  bVar1 = this->m_needSeiCorrection;
  if ((((this->m_lastIFrame == true) && (uVar3 != 0xffffffff)) &&
      (this->m_lastSlicePPS != 0xffffffff)) &&
     (((byte)((uVar2 & 0x20) >> 5) & bVar1) != 0 || bVar12 != 0)) {
    avPacket->flags = uVar2 | 0x20;
    if (((this->m_firstSPSWarn == true) && (0xfa < (this->super_MPEGStreamReader).m_totalFrameNum))
       && (this->m_firstSPSWarn = false, bVar12 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"H264 bitstream changed: insert SPS/PPS units",0x2c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      sLastMsg = true;
    }
    p_Var14 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var13 = p_Var9;
    if (p_Var14 != (_Base_ptr)0x0) {
      do {
        bVar16 = p_Var14[1]._M_color < this->m_lastSliceSPS;
        if (!bVar16) {
          p_Var13 = p_Var14;
        }
        p_Var14 = (&p_Var14->_M_left)[bVar16];
      } while (p_Var14 != (_Base_ptr)0x0);
    }
    if ((p_Var13 != p_Var9) && (p_Var13[1]._M_color <= this->m_lastSliceSPS)) {
      p_Var9 = p_Var13;
    }
    if ((long)dstEnd - (long)dstBuffer_00 < 4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d0,"H264 stream error: Not enough buffer for write headers",0x36
                );
      puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar11 = 3;
      *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
      if (local_218 == &local_208) {
        puVar11[6] = local_208;
        puVar11[7] = uStack_204;
        puVar11[8] = uStack_200;
        puVar11[9] = uStack_1fc;
      }
      else {
        *(uint **)(puVar11 + 2) = local_218;
        *(ulong *)(puVar11 + 6) = CONCAT44(uStack_204,local_208);
      }
      *(undefined8 *)(puVar11 + 4) = local_210;
      local_210 = 0;
      local_208 = local_208 & 0xffffff00;
      local_218 = &local_208;
      __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    pNVar5 = (NALUnit *)p_Var9[1]._M_parent;
    if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
      *dstBuffer_00 = '\0';
      dstBuffer_00 = dstBuffer_00 + 1;
    }
    dstBuffer_00[0] = '\0';
    dstBuffer_00[1] = '\0';
    dstBuffer_00[2] = '\x01';
    iVar8 = NALUnit::serializeBuffer(pNVar5,dstBuffer_00 + 3,dstEnd,false);
    if (iVar8 == -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d0,"H264 stream error: Not enough buffer for write headers",0x36
                );
      puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar11 = 3;
      *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
      if (local_238 == &local_228) {
        puVar11[6] = local_228;
        puVar11[7] = uStack_224;
        puVar11[8] = uStack_220;
        puVar11[9] = uStack_21c;
      }
      else {
        *(uint **)(puVar11 + 2) = local_238;
        *(ulong *)(puVar11 + 6) = CONCAT44(uStack_224,local_228);
      }
      *(undefined8 *)(puVar11 + 4) = local_230;
      local_230 = 0;
      local_228 = local_228 & 0xffffff00;
      local_238 = &local_228;
      __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    dstBuffer_00 = dstBuffer_00 + 3 + iVar8;
    for (p_Var10 = (this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      if ((long)dstEnd - (long)dstBuffer_00 < 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1d0,"H264 stream error: Not enough buffer for write headers",
                   0x36);
        puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar11 = 3;
        *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
        if (local_258 == &local_248) {
          puVar11[6] = local_248;
          puVar11[7] = uStack_244;
          puVar11[8] = uStack_240;
          puVar11[9] = uStack_23c;
        }
        else {
          *(uint **)(puVar11 + 2) = local_258;
          *(ulong *)(puVar11 + 6) = CONCAT44(uStack_244,local_248);
        }
        *(undefined8 *)(puVar11 + 4) = local_250;
        local_250 = 0;
        local_248 = local_248 & 0xffffff00;
        local_258 = &local_248;
        __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      pNVar5 = (NALUnit *)p_Var10[1]._M_parent;
      if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
        *dstBuffer_00 = '\0';
        dstBuffer_00 = dstBuffer_00 + 1;
      }
      dstBuffer_00[0] = '\0';
      dstBuffer_00[1] = '\0';
      dstBuffer_00[2] = '\x01';
      iVar8 = NALUnit::serializeBuffer(pNVar5,dstBuffer_00 + 3,dstEnd,false);
      if (iVar8 == -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1d0,"H264 stream error: Not enough buffer for write headers",
                   0x36);
        puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar11 = 3;
        *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
        if (local_278 == &local_268) {
          puVar11[6] = local_268;
          puVar11[7] = uStack_264;
          puVar11[8] = uStack_260;
          puVar11[9] = uStack_25c;
        }
        else {
          *(uint **)(puVar11 + 2) = local_278;
          *(ulong *)(puVar11 + 6) = CONCAT44(uStack_264,local_268);
        }
        *(undefined8 *)(puVar11 + 4) = local_270;
        local_268 = local_268 & 0xffffff00;
        __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      dstBuffer_00 = dstBuffer_00 + 3 + iVar8;
    }
  }
  if ((bVar1 & uVar3 != 0xffffffff) != 0) {
    if (this->m_firstSEIWarn == true) {
      this->m_firstSEIWarn = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "H264 bitstream changed: insert pict timing and buffering period SEI units",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      sLastMsg = true;
    }
    if (this->m_lastIFrame == true) {
      if (this->m_lastSliceIDR == true) {
        local_1d0.m_processedMessages._M_h._M_buckets =
             &local_1d0.m_processedMessages._M_h._M_single_bucket;
        local_1d0.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
        local_1d0.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
        local_1d0.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
        local_1d0.super_NALUnit.bitReader.m_curVal = 0;
        local_1d0.super_NALUnit.bitReader.m_bitLeft = 0;
        local_1d0.super_NALUnit.nal_unit_type = nuUnspecified;
        local_1d0.super_NALUnit.nal_ref_idc = 0;
        local_1d0.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
        local_1d0.super_NALUnit.m_nalBufferLen = 0;
        local_1d0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_002404a0;
        local_1d0.pic_struct = '\0';
        local_1d0.m_processedMessages._M_h._M_bucket_count = 1;
        local_1d0.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d0.m_processedMessages._M_h._M_element_count = 0;
        local_1d0.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        memset(&local_1d0.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
        local_1d0.number_of_offset_sequences = -1;
        local_1d0.metadataPtsOffset = 0;
        local_1d0.m_mvcHeaderLen = 0;
        local_1d0.m_mvcHeaderStart = (uint8_t *)0x0;
        local_1d0.initial_cpb_removal_delay[0] = 0xd0bd8;
        local_1d0.initial_cpb_removal_delay_offset[0] = 0;
        iVar8 = writeSEIMessage(this,dstBuffer_00,dstEnd,&local_1d0,'\0');
        dstBuffer_00 = dstBuffer_00 + iVar8;
        SEIUnit::~SEIUnit(&local_1d0);
      }
      if ((this->m_mvcSubStream == true) &&
         (puVar4 = (this->m_bdRomMetaDataMsg).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
         puVar4 != (this->m_bdRomMetaDataMsg).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish)) {
        SEIUnit::updateMetadataPts
                  (puVar4 + this->m_bdRomMetaDataMsgPtsPos,
                   (this->super_MPEGStreamReader).m_curDts / 0xe5b0 + this->m_startPts);
        puVar15 = dstBuffer_00;
        if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
          puVar15 = dstBuffer_00 + 1;
          *dstBuffer_00 = '\0';
        }
        puVar15[0] = '\0';
        puVar15[1] = '\0';
        puVar15[2] = '\x01';
        iVar8 = NALUnit::encodeNAL(puVar4,puVar4 + ((long)(this->m_bdRomMetaDataMsg).
                                                                                                                    
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_bdRomMetaDataMsg).
                                                                                                                
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                   puVar15 + 3,(long)dstEnd - (long)(puVar15 + 3));
        puVar15 = puVar15 + (long)iVar8 + 3;
        if (local_1d8 != (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)0x0) {
          local_1d0.super_NALUnit._vptr_NALUnit =
               (_func_int **)
               CONCAT44((int)puVar15 - (int)dstBuffer_00,(int)dstBuffer_00 - (int)dstBuffer);
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>(local_1d8,(pair<int,_int> *)&local_1d0);
        }
        puVar6 = (this->m_bdRomMetaDataMsg).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dstBuffer_00 = puVar15;
        if ((this->m_bdRomMetaDataMsg).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar6) {
          (this->m_bdRomMetaDataMsg).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar6;
        }
      }
    }
    local_1d0.m_processedMessages._M_h._M_buckets =
         &local_1d0.m_processedMessages._M_h._M_single_bucket;
    local_1d0.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
    local_1d0.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
    local_1d0.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
    local_1d0.super_NALUnit.bitReader.m_curVal = 0;
    local_1d0.super_NALUnit.bitReader.m_bitLeft = 0;
    local_1d0.super_NALUnit.nal_unit_type = nuUnspecified;
    local_1d0.super_NALUnit.nal_ref_idc = 0;
    local_1d0.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
    local_1d0.super_NALUnit.m_nalBufferLen = 0;
    local_1d0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_002404a0;
    local_1d0.pic_struct = '\0';
    local_1d0.m_processedMessages._M_h._M_bucket_count = 1;
    local_1d0.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1d0.m_processedMessages._M_h._M_element_count = 0;
    local_1d0.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    memset(&local_1d0.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
    local_1d0.number_of_offset_sequences = -1;
    local_1d0.metadataPtsOffset = 0;
    local_1d0.m_mvcHeaderLen = 0;
    local_1d0.m_mvcHeaderStart = (uint8_t *)0x0;
    local_1d0.cpb_removal_delay = this->m_removalDelay;
    lVar7 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
    local_1d0.dpb_output_delay =
         (uint32_t)
         (((this->m_frameDepth * lVar7 +
           ((this->super_MPEGStreamReader).m_curPts - (this->super_MPEGStreamReader).m_curDts)) * 2)
         / lVar7);
    local_1d0.pic_struct = this->m_lastPictStruct;
    if (this->m_lastSliceIDR == true) {
      this->m_removalDelay = 0;
    }
    this->m_removalDelay = this->m_removalDelay + 2;
    iVar8 = writeSEIMessage(this,dstBuffer_00,dstEnd,&local_1d0,'\x01');
    dstBuffer_00 = dstBuffer_00 + iVar8;
    SEIUnit::~SEIUnit(&local_1d0);
  }
  this->m_firstFileFrame = false;
  return (int)dstBuffer_00 - (int)dstBuffer;
}

Assistant:

int H264StreamReader::writeAdditionData(uint8_t *dstBuffer, uint8_t *dstEnd, AVPacket &avPacket,
                                        PriorityDataInfo *priorityData)
{
    uint8_t *curPos = dstBuffer;
    if (avPacket.size > 4 && avPacket.size < dstEnd - dstBuffer)
    {
        auto nalType = static_cast<NALUnit::NALType>(avPacket.data[4] & 0x1f);
        if (nalType == NALUnit::NALType::nuDelimiter || nalType == NALUnit::NALType::nuDRD)
        {
            // place delimiter at first place
            m_delimiterFound = true;
            memcpy(curPos, avPacket.data, avPacket.size);
            curPos += avPacket.size;
            avPacket.size = 0;
            avPacket.data = nullptr;
        }
    }

    if (!m_delimiterFound && m_lastSliceSPS != UINT_MAX)
    {
        if (m_firstAUDWarn)
        {
            m_firstAUDWarn = false;
            LTRACE(LT_INFO, 2, "H264 bitstream changed: insert nal unit delimiters");
        }
        if (dstEnd - curPos < 6)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos = writeNalPrefix(curPos);
        if (m_mvcSubStream && m_blurayMode)
        {
            *curPos++ = static_cast<uint8_t>(NALUnit::NALType::nuDRD);
        }
        else
        {
            *curPos++ = static_cast<uint8_t>(NALUnit::NALType::nuDelimiter);
            *curPos++ = static_cast<uint8_t>(m_pict_type << 5 | 0x10);  // primary_pic_type << 5 + rbsp bits
        }
    }

    bool needInsTimingSEI = m_needSeiCorrection && m_lastSliceSPS != UINT_MAX;
    bool srcSpsPpsFound = avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP;
    bool spsDiscontinue =
        m_h264SPSCont &&
        ((m_spsCounter < 2 && ((m_totalFrameNum > 1 && m_lastSliceIDR) || (m_totalFrameNum > 250 && isIFrame()))) ||
         (m_firstFileFrame && !srcSpsPpsFound));
    bool needInsSpsPps = false;
    if (isIFrame() && m_lastSliceSPS != UINT_MAX && m_lastSlicePPS != UINT_MAX)
    {
        needInsSpsPps = spsDiscontinue || (replaceToOwnSPS() && srcSpsPpsFound);
    }

    if (needInsSpsPps)
    {
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

        // Why the check for 250 : unless we see the 2nd IDR frame, we can only see that the stream runs with open GOPs
        // (open GOPs with one IDR at start for the whole movie do happen). That's why there's also a check that there's
        // a SPS before for the first I-frame in the first GOP in a normal stream. There's nothing scary about that - we
        // simply insert one more SPS - but in order to avoid outputting messages into the console, I left the check at
        // 250.
        if (m_firstSPSWarn && m_totalFrameNum > 250)
        {
            m_firstSPSWarn = false;
            if (spsDiscontinue)
            {
                LTRACE(LT_INFO, 2, "H264 bitstream changed: insert SPS/PPS units");
            }
        }
        SPSUnit *sps = m_spsMap.find(m_lastSliceSPS)->second;
        if (dstEnd - curPos < 4)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos = writeNalPrefix(curPos);
        int sRez = sps->serializeBuffer(curPos, dstEnd, false);
        if (sRez == -1)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos += sRez;

        // PPSUnit* pps = m_ppsMap.find(m_lastSlicePPS)->second;
        // curPos = writeNalPrefix(curPos);
        // curPos += pps->serializeBuffer(curPos, false);
        for (auto [index, pps] : m_ppsMap)
        {
            if (dstEnd - curPos < 4)
                THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
            curPos = writeNalPrefix(curPos);
            sRez = pps->serializeBuffer(curPos, dstEnd, false);
            if (sRez == -1)
                THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
            curPos += sRez;
        }
    }

    if (needInsTimingSEI)
    {
        if (m_firstSEIWarn)
        {
            m_firstSEIWarn = false;
            LTRACE(LT_INFO, 2, "H264 bitstream changed: insert pict timing and buffering period SEI units");
        }

        if (m_lastIFrame)
        {
            if (m_lastSliceIDR)
            {
                SEIUnit sei;
                sei.initial_cpb_removal_delay[0] = 855000;
                sei.initial_cpb_removal_delay_offset[0] = 0;
                curPos += writeSEIMessage(curPos, dstEnd, sei, SEI_MSG_BUFFERING_PERIOD);
            }

            if (m_mvcSubStream)
            {
                if (!m_bdRomMetaDataMsg.empty())
                {
                    // we got slice. fill previous metadata SEI message
                    auto pts90k = m_curDts / INT_FREQ_TO_TS_FREQ + m_startPts;
                    uint8_t *srcData = m_bdRomMetaDataMsg.data();
                    SEIUnit::updateMetadataPts(srcData + m_bdRomMetaDataMsgPtsPos, pts90k);

                    uint8_t *prevPos = curPos;
                    curPos = writeNalPrefix(curPos);
                    curPos += NALUnit::encodeNAL(srcData, srcData + m_bdRomMetaDataMsg.size(), curPos, dstEnd - curPos);
                    if (priorityData)
                        priorityData->push_back(std::make_pair<int, int>(static_cast<int>(prevPos - dstBuffer),
                                                                         static_cast<int>(curPos - prevPos)));
                    m_bdRomMetaDataMsg.clear();
                }
            }
        }

        SEIUnit sei;
        sei.cpb_removal_delay = m_removalDelay;
        sei.dpb_output_delay =
            static_cast<int>(((m_curPts - m_curDts + m_pcrIncPerFrame * getFrameDepth()) * 2) / m_pcrIncPerFrame);
        sei.pic_struct = m_lastPictStruct;

        if (m_lastSliceIDR)
            m_removalDelay = 0;
        m_removalDelay += 2;
        curPos += writeSEIMessage(curPos, dstEnd, sei, SEI_MSG_PIC_TIMING);
    }
    m_firstFileFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}